

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O1

void __thiscall MacProj::install_level(MacProj *this,int level,AmrLevel *level_data)

{
  ostringstream *this_00;
  int iVar1;
  pointer puVar2;
  tuple<amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_> tVar3;
  AmrLevel *pAVar4;
  pointer pIVar5;
  __uniq_ptr_data<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>,_true,_true> this_01
  ;
  long lVar6;
  char local_1b1;
  Print local_1b0;
  
  if (verbose != 0) {
    local_1b0.os = amrex::OutStream();
    this_00 = &local_1b0.ss;
    local_1b0.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_1b0.rank = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    *(undefined8 *)(&local_1b0.field_0x18 + *(long *)(local_1b0._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b0.os + *(long *)(*(long *)local_1b0.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Installing MacProj level ",0x19);
    std::ostream::operator<<(this_00,level);
    local_1b1 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_1b1,1);
    amrex::Print::~Print(&local_1b0);
  }
  iVar1 = *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  lVar6 = (long)iVar1;
  if (iVar1 < this->finest_level) {
    do {
      puVar2 = (this->mac_reg).
               super_vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tVar3.super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>
      .super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_> *)
            &puVar2[lVar6 + 1]._M_t.
             super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>;
      puVar2[lVar6 + 1]._M_t.
      super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_> =
           (__uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>)0x0;
      if (tVar3.
          super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>.
          super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::FluxRegister_*,_false>)0x0) {
        (**(code **)(*(long *)tVar3.
                              super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>
                              .super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl + 8)
        )();
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->finest_level);
  }
  iVar1 = *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  this->finest_level = iVar1;
  if (this->finest_level_allocated < level) {
    this->finest_level_allocated = iVar1;
    std::vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::resize
              (&(this->LevelData).
                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>,(long)iVar1 + 1)
    ;
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::resize(&(this->mac_phi_crse).
              super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ,(long)this->finest_level + 1);
    std::
    vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
    ::resize(&(this->mac_reg).
              super_vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
             ,(long)this->finest_level + 1);
  }
  (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
  super__Vector_impl_data._M_start[level] = level_data;
  if (0 < level) {
    puVar2 = (this->mac_reg).
             super_vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_01.super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>.
    _M_t.super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>.
    super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>)
         operator_new(0x988);
    pAVar4 = (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
             super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
             super__Vector_impl_data._M_start[level];
    pIVar5 = (this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_1b0._0_8_ = *(undefined8 *)pIVar5[(ulong)(uint)level + 0xffffffffffffffff].vect;
    local_1b0.os = (ostream *)
                   CONCAT44(local_1b0.os._4_4_,
                            *(int *)((long)(pIVar5 + (ulong)(uint)level + 0xffffffffffffffff) + 8));
    amrex::FluxRegister::FluxRegister
              ((FluxRegister *)
               this_01.
               super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>
               .super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl,&pAVar4->grids,
               &pAVar4->dmap,(IntVect *)&local_1b0,level,1);
    tVar3.super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>.
    super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_> *)
          &puVar2[(uint)level]._M_t.
           super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>;
    puVar2[(uint)level]._M_t.
    super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_> =
         this_01.
         super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>._M_t.
         super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>.
         super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl;
    if (tVar3.
        super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>.
        super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::FluxRegister_*,_false>)0x0) {
      (**(code **)(*(long *)tVar3.
                            super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>
                            .super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl + 8))
                ();
    }
  }
  return;
}

Assistant:

void
MacProj::install_level (int       level,
                        AmrLevel* level_data)
{
    if (verbose) amrex::Print() << "Installing MacProj level " << level << '\n';
    if (parent->finestLevel() < finest_level)
        for (int lev = parent->finestLevel() + 1; lev <= finest_level; lev++)
            mac_reg[lev].reset();

    finest_level = parent->finestLevel();

    if (level > finest_level_allocated)
    {
        finest_level_allocated = finest_level;
        LevelData.resize(finest_level+1);
        mac_phi_crse.resize(finest_level+1);
        mac_reg.resize(finest_level+1);
    }

    LevelData[level] = level_data;

    if (level > 0)
    {
        mac_reg[level].reset(new FluxRegister(LevelData[level]->boxArray(),
                                              LevelData[level]->DistributionMap(),
                                              parent->refRatio(level-1),level,1));
    }

}